

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<64,_1024>::Mark(ObjectBlockPool<64,_1024> *this,uint number)

{
  MyLargeBlock *pMVar1;
  MyLargeBlock *pMVar2;
  int iVar3;
  ulong uVar4;
  Block *pBVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (number < 2) {
    pMVar1 = this->activePages;
    if (pMVar1 != (MyLargeBlock *)0x0) {
      uVar4 = (ulong)this->lastNum;
      pMVar2 = pMVar1;
      do {
        if ((pMVar1 != pMVar2) || (iVar3 = (int)uVar4, uVar4 = 0, iVar3 != 0)) {
          pBVar5 = pMVar1->page;
          uVar6 = 0;
          do {
            pBVar5->marker = pBVar5->marker & 0xfffffffffffffffe | (ulong)number;
            uVar6 = uVar6 + 1;
            pMVar2 = this->activePages;
            uVar4 = (ulong)this->lastNum;
            uVar7 = 0x400;
            if (pMVar1 == pMVar2) {
              uVar7 = uVar4;
            }
            pBVar5 = pBVar5 + 1;
          } while (uVar6 < uVar7);
        }
        pMVar1 = pMVar1->next;
      } while (pMVar1 != (LargeBlock<64,_1024> *)0x0);
    }
    return;
  }
  __assert_fail("number <= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StdLib.cpp"
                ,0xe6,
                "void ObjectBlockPool<64, 1024>::Mark(unsigned int) [elemSize = 64, countInBlock = 1024]"
               );
}

Assistant:

void Mark(unsigned int number)
	{
		assert(number <= 1);
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			for(unsigned int i = 0; i < (curr == activePages ? lastNum : countInBlock); i++)
			{
				curr->page[i].marker = (curr->page[i].marker & ~NULLC::OBJECT_VISIBLE) | number;
			}
			curr = curr->next;
		}
	}